

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void gm_dealloc_thread_data(AV1_COMP *cpi,int num_workers)

{
  GlobalMotionData *gm_data;
  int in_ESI;
  long in_RDI;
  ThreadData_conflict *td;
  EncWorkerData *thread_data;
  int j;
  MultiThreadInfo *mt_info;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    gm_data = *(GlobalMotionData **)(*(long *)(in_RDI + 0x9ae88) + (long)local_1c * 0x1d0 + 8);
    if (gm_data != (GlobalMotionData *)(in_RDI + 0x15030)) {
      gm_dealloc_data(gm_data);
    }
  }
  return;
}

Assistant:

static inline void gm_dealloc_thread_data(AV1_COMP *cpi, int num_workers) {
  MultiThreadInfo *mt_info = &cpi->mt_info;
  for (int j = 0; j < num_workers; j++) {
    EncWorkerData *thread_data = &mt_info->tile_thr_data[j];
    ThreadData *td = thread_data->td;
    if (td != &cpi->td) gm_dealloc_data(&td->gm_data);
  }
}